

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.h
# Opt level: O2

void __thiscall libDAI::BP::updateMessage(BP *this,size_t iI)

{
  Real a;
  _Vector_base<double,_std::allocator<double>_> _Stack_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  a = (this->Props).damping;
  if ((a == 0.0) && (!NAN(a))) {
    TProb<double>::operator=
              ((this->_messages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start + iI,
               (this->_newmessages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start + iI);
    return;
  }
  TProb<double>::operator^
            ((TProb<double> *)&local_40,
             (this->_messages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + iI,a);
  TProb<double>::operator^
            ((TProb<double> *)&_Stack_58,
             (this->_newmessages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + iI,1.0 - (this->Props).damping);
  TProb<double>::operator*
            ((TProb<double> *)&local_28,(TProb<double> *)&local_40,(TProb<double> *)&_Stack_58);
  TProb<double>::operator=
            ((this->_messages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + iI,(TProb<double> *)&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void updateMessage(size_t iI) {
                if( Props.damping == 0.0 )
                    _messages[iI] = _newmessages[iI];
                else
                    _messages[iI] = (_messages[iI] ^ Props.damping) * (_newmessages[iI] ^ (1.0 - Props.damping));
            }